

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_core.c
# Opt level: O1

gravity_value_t convert_map2string(gravity_vm *vm,gravity_map_t *map)

{
  gravity_value_t *pgVar1;
  gravity_class_t *pgVar2;
  uint32_t n;
  char *s;
  gravity_list_t *data;
  gravity_class_t **ppgVar3;
  char *__src;
  ulong uVar4;
  int iVar5;
  ulong uVar6;
  uint uVar7;
  gravity_class_t *pgVar8;
  anon_union_8_3_4e90ac68_for_gravity_value_t_1 aVar9;
  size_t __n;
  char *__src_00;
  ulong uVar10;
  anon_union_8_3_4e90ac68_for_gravity_value_t_1 aVar11;
  size_t __n_00;
  long lVar12;
  uint uVar13;
  gravity_value_t v;
  gravity_value_t v_00;
  gravity_value_t gVar14;
  gravity_value_t gVar15;
  uint local_7c;
  
  uVar10 = 1;
  s = (char *)gravity_calloc((gravity_vm *)0x0,1,0x201);
  *s = '[';
  n = gravity_hash_count(map->hash);
  data = gravity_list_new(vm,n);
  gravity_hash_iterate(map->hash,map_keys_array,data);
  uVar4 = (ulong)(uint)(data->array).n;
  if (uVar4 == 0) {
    uVar6 = 1;
  }
  else {
    uVar6 = 1;
    local_7c = 0x200;
    lVar12 = 0;
    do {
      pgVar1 = (data->array).p;
      pgVar2 = *(gravity_class_t **)((long)&pgVar1->isa + lVar12);
      aVar11 = (anon_union_8_3_4e90ac68_for_gravity_value_t_1)
               ((anon_union_8_3_4e90ac68_for_gravity_value_t_1 *)((long)&pgVar1->field_1 + lVar12))
               ->n;
      gVar14.field_1.n = aVar11.n;
      gVar14.isa = pgVar2;
      ppgVar3 = &gravity_hash_lookup(map->hash,gVar14)->isa;
      if ((gravity_value_t *)ppgVar3 == (gravity_value_t *)0x0) {
        ppgVar3 = &gravity_class_null;
        aVar9.n = 0;
      }
      else {
        aVar9 = (anon_union_8_3_4e90ac68_for_gravity_value_t_1)
                (((gravity_value_t *)ppgVar3)->field_1).n;
      }
      pgVar8 = ((gravity_value_t *)ppgVar3)->isa;
      if (pgVar2 != gravity_class_string) {
        v.field_1.n = aVar11.n;
        v.isa = pgVar2;
        gVar14 = convert_value2string(vm,v);
      }
      aVar11 = gVar14.field_1;
      if (gVar14.isa != gravity_class_string) {
        aVar11.n = 0;
      }
      if ((gravity_map_t *)aVar9.n == map && gravity_class_map == pgVar8) {
        aVar9.n = 0;
        pgVar8 = gravity_class_null;
      }
      gVar15.field_1.n = aVar9.n;
      gVar15.isa = pgVar8;
      if (pgVar8 != gravity_class_string) {
        v_00.field_1.n = aVar9.n;
        v_00.isa = pgVar8;
        gVar15 = convert_value2string(vm,v_00);
      }
      aVar9 = gVar15.field_1;
      if (gVar15.isa != gravity_class_string) {
        aVar9.n = 0;
      }
      __src_00 = "N/A";
      if (aVar11.n == 0) {
        __n_00 = 3;
      }
      else {
        __src_00 = (char *)(aVar11.p)->objclass;
        __n_00 = (size_t)*(uint *)((long)&(aVar11.p)->identifier + 4);
      }
      __src = "N/A";
      if (aVar9.n == 0) {
        __n = 3;
      }
      else {
        __src = (char *)(aVar9.p)->objclass;
        __n = (size_t)*(uint *)((long)&(aVar9.p)->identifier + 4);
      }
      uVar7 = (int)uVar6 + (int)__n_00;
      uVar13 = uVar7 + (int)__n + 4;
      if (local_7c < uVar13) {
        local_7c = uVar13 + local_7c;
        s = (char *)gravity_realloc((gravity_vm *)0x0,s,(ulong)local_7c);
      }
      memcpy(s + uVar6,__src_00,__n_00);
      s[uVar7] = ':';
      memcpy(s + ((int)__n_00 + (int)uVar6 + 1),__src,__n);
      iVar5 = uVar7 + (int)__n;
      uVar6 = (ulong)(iVar5 + 1);
      if (uVar10 < uVar4) {
        s[uVar6] = ',';
        uVar6 = (ulong)(iVar5 + 2);
      }
      lVar12 = lVar12 + 0x10;
      uVar10 = uVar10 + 1;
    } while (uVar4 << 4 != lVar12);
  }
  s[uVar6] = ']';
  uVar7 = (int)uVar6 + 1;
  s[uVar7] = '\0';
  gVar14 = gravity_string_to_value(vm,s,uVar7);
  free(s);
  return gVar14;
}

Assistant:

static inline gravity_value_t convert_map2string (gravity_vm *vm, gravity_map_t *map) {
    // allocate initial memory to a 512 buffer
    uint32_t len = 512;
    char *buffer = mem_alloc(NULL, len+1);
    buffer[0] = '[';
    uint32_t pos = 1;

    // get keys list
    uint32_t count = gravity_hash_count(map->hash);
    gravity_list_t *list = gravity_list_new(vm, count);
    gravity_hash_iterate(map->hash, map_keys_array, (void *)list);

    count = (uint32_t) marray_size(list->array);
    for (uint32_t i=0; i<count; ++i) {
        gravity_value_t key = marray_get(list->array, i);
        gravity_value_t *valueptr = gravity_hash_lookup(map->hash, key);
        gravity_value_t value = (valueptr) ? *valueptr : VALUE_FROM_NULL;
        
        // key conversion
        if (!VALUE_ISA_STRING(key)) {
            key = convert_value2string(vm, key);
        }
        gravity_string_t *key_string = (VALUE_ISA_STRING(key)) ? VALUE_AS_STRING(key) : NULL;
        
        // value conversion
        if (VALUE_ISA_MAP(value) && (VALUE_AS_MAP(value) == map)) {
            // to avoid infinite loop
            value = VALUE_FROM_NULL;
        }
        if (!VALUE_ISA_STRING(value)) {
            value = convert_value2string(vm, value);
        }
        gravity_string_t *value_string = (VALUE_ISA_STRING(value)) ? VALUE_AS_STRING(value) : NULL;
        
        // KEY
        char *s1 = (key_string) ? key_string->s : "N/A";
        uint32_t len1 = (key_string) ? key_string->len : 3;

        // VALUE
        char *s2 = (value_string) ? value_string->s : "N/A";
        uint32_t len2 = (value_string) ? value_string->len : 3;

        // check if buffer needs to be reallocated
        if (len1 + len2 + pos + 4 > len) {
            len = (len1 + len2 + pos + 4) + len;
            buffer = mem_realloc(NULL, buffer, len);
        }

        // copy key string to new buffer
        memcpy(buffer+pos, s1, len1);
        pos += len1;

        // copy ':' key/value separator
        memcpy(buffer+pos, ":", 1);
        pos += 1;

        // copy value string to new buffer
        memcpy(buffer+pos, s2, len2);
        pos += len2;

        // add entries separator
        if (i+1 < count) {
            memcpy(buffer+pos, ",", 1);
            pos += 1;
        }
    }

    // Write latest ] character
    memcpy(buffer+pos, "]", 1);
    buffer[++pos] = 0;

    gravity_value_t result = VALUE_FROM_STRING(vm, buffer, pos);
    mem_free(buffer);
    return result;
}